

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>::
DeleteProperty_Internal<true>
          (SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false> *this,
          DynamicObject *instance,PropertyId propertyId,
          PropertyOperationFlags propertyOperationFlags)

{
  code *pcVar1;
  Var propertyKey;
  PropertyRecord *descriptor_00;
  SimpleDictionaryPropertyDescriptor<int> *scriptContext_00;
  PropertyOperationFlags flags;
  DynamicObject *pDVar2;
  bool bVar3;
  byte bVar4;
  BOOL BVar5;
  uint32 index;
  SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_false> *pSVar6;
  DynamicType *pDVar7;
  undefined4 *puVar8;
  ScriptContext *pSVar9;
  BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
  *this_00;
  char16 *varName;
  JavascriptLibrary *this_01;
  RecyclableObject *pRVar10;
  RecyclerWeakReference<Js::DynamicObject> **ppRVar11;
  RecyclerWeakReference<Js::DynamicObject> *this_02;
  DynamicObject *pDVar12;
  Type *this_03;
  SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false> *this_04;
  SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false> *simpleBase;
  bool fConvertToStringKeyedHandler;
  Var undefined;
  PropertyRecord *propertyRecord;
  SimpleDictionaryPropertyDescriptor<int> *descriptor;
  ScriptContext *scriptContext;
  PropertyOperationFlags propertyOperationFlags_local;
  PropertyId propertyId_local;
  DynamicObject *instance_local;
  SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false> *this_local;
  
  scriptContext._0_4_ = propertyOperationFlags;
  scriptContext._4_4_ = propertyId;
  _propertyOperationFlags_local = instance;
  instance_local = (DynamicObject *)this;
  bVar3 = DynamicTypeHandler::GetIsLocked(&this->super_DynamicTypeHandler);
  if (bVar3) {
    this_04 = ConvertToNonSharedSimpleDictionaryType(this,_propertyOperationFlags_local);
    BVar5 = DeleteProperty_Internal<true>
                      (this_04,_propertyOperationFlags_local,scriptContext._4_4_,
                       (PropertyOperationFlags)scriptContext);
    return BVar5;
  }
  if (((((DAT_01eca29c & 1) != 0) &&
       (bVar3 = TMapKey_IsJavascriptString<Js::JavascriptString*>(), !bVar3)) &&
      (((byte)this->field_0x28 >> 1 & 1) == 0)) && (((byte)this->field_0x28 >> 2 & 1) == 0)) {
    pSVar6 = SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false>::
             ConvertToSimpleDictionaryUnorderedTypeHandler<int,Js::JavascriptString*,false>
                       ((SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false> *)this,
                        _propertyOperationFlags_local);
    BVar5 = DeleteProperty(&pSVar6->
                            super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>
                           ,_propertyOperationFlags_local,scriptContext._4_4_,
                           (PropertyOperationFlags)scriptContext);
    return BVar5;
  }
  pDVar7 = DynamicObject::GetDynamicType(_propertyOperationFlags_local);
  bVar3 = DynamicType::GetIsLocked(pDVar7);
  if (bVar3) {
    bVar3 = DynamicTypeHandler::GetIsShared(&this->super_DynamicTypeHandler);
    if (bVar3) {
LAB_0149da6d:
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0x6ab,
                                  "(!GetIsShared() && !instance->GetDynamicType()->GetIsShared())",
                                  "!GetIsShared() && !instance->GetDynamicType()->GetIsShared()");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    else {
      pDVar7 = DynamicObject::GetDynamicType(_propertyOperationFlags_local);
      bVar3 = DynamicType::GetIsShared(pDVar7);
      if (bVar3) goto LAB_0149da6d;
    }
    DynamicObject::ChangeType(_propertyOperationFlags_local);
  }
  descriptor = (SimpleDictionaryPropertyDescriptor<int> *)
               RecyclableObject::GetScriptContext
                         (&_propertyOperationFlags_local->super_RecyclableObject);
  if (scriptContext._4_4_ == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x6b3,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  pSVar9 = RecyclableObject::GetScriptContext
                     (&_propertyOperationFlags_local->super_RecyclableObject);
  undefined = ScriptContext::GetPropertyName(pSVar9,scriptContext._4_4_);
  this_00 = Memory::
            WriteBarrierPtr<JsUtil::BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>_>
            ::operator->(&this->propertyMap);
  bVar3 = JsUtil::
          BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
                      *)this_00,(PropertyRecord **)&undefined,
                     (SimpleDictionaryPropertyDescriptor<int> **)&propertyRecord);
  flags = (PropertyOperationFlags)scriptContext;
  scriptContext_00 = descriptor;
  if (!bVar3) {
    bVar3 = DynamicObject::HasObjectArray(_propertyOperationFlags_local);
    if ((bVar3) &&
       (bVar3 = PropertyRecord::IsNumeric((PropertyRecord *)undefined),
       pDVar2 = _propertyOperationFlags_local, bVar3)) {
      index = PropertyRecord::GetNumericValue((PropertyRecord *)undefined);
      BVar5 = DynamicTypeHandler::DeleteItem
                        (&this->super_DynamicTypeHandler,pDVar2,index,
                         (PropertyOperationFlags)scriptContext);
      return BVar5;
    }
    return 1;
  }
  if (((ulong)(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject & 0x800) != 0) {
    return 1;
  }
  if ((((ulong)(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
               _vptr_IRecyclerVisitedObject & 0x200) == 0) ||
     (((ulong)(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject & 0x1000) != 0)) {
    varName = PropertyRecord::GetBuffer((PropertyRecord *)undefined);
    JavascriptError::ThrowCantDeleteIfStrictModeOrNonconfigurable
              (flags,(ScriptContext *)scriptContext_00,varName);
    return 0;
  }
  if (((ulong)(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject & 0x1000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x6c8,"(!(descriptor->Attributes & 0x10))",
                                "!(descriptor->Attributes & PropertyLetConstGlobal)");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  this_01 = ScriptContext::GetLibrary((ScriptContext *)descriptor);
  pRVar10 = JavascriptLibraryBase::GetUndefined(&this_01->super_JavascriptLibraryBase);
  if (*(int *)((long)&(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject + 4) != -1) {
    bVar3 = SupportsSwitchingToUnordered(this,(ScriptContext *)descriptor);
    if ((bVar3) &&
       (this->numDeletedProperties = this->numDeletedProperties + '\x01',
       DAT_01eca298 <= (int)(uint)this->numDeletedProperties)) {
      bVar3 = false;
      if (((byte)this->field_0x28 >> 2 & 1) == 0) {
        pRVar10 = ForInObjectEnumerator::GetFirstPrototypeWithEnumerableProperties
                            (&_propertyOperationFlags_local->super_RecyclableObject,
                             (RecyclableObject **)0x0);
        bVar3 = pRVar10 == (RecyclableObject *)0x0;
      }
      if (bVar3) {
        bVar3 = Phases::IsEnabled((Phases *)&DAT_01ec73f0,TypeHandlerTransitionPhase);
        if (bVar3) {
          Output::Print(L"Transitioning to string keyed SimpleDictionaryUnorderedTypeHandler\n");
          Output::Flush();
        }
        pSVar6 = SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false>::
                 ConvertToSimpleDictionaryUnorderedTypeHandler<int,Js::JavascriptString*,false>
                           ((SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false> *)this
                            ,_propertyOperationFlags_local);
        BVar5 = DeleteProperty(&pSVar6->
                                super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>
                               ,_propertyOperationFlags_local,scriptContext._4_4_,
                               (PropertyOperationFlags)scriptContext);
        return BVar5;
      }
      bVar3 = Phases::IsEnabled((Phases *)&DAT_01ec73f0,TypeHandlerTransitionPhase);
      if (bVar3) {
        Output::Print(
                     L"Transitioning to PropertyRecord keyed SimpleDictionaryUnorderedTypeHandler\n"
                     );
        Output::Flush();
      }
      pSVar6 = SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false>::
               ConvertToSimpleDictionaryUnorderedTypeHandler<int,Js::JavascriptString*,false>
                         ((SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false> *)this,
                          _propertyOperationFlags_local);
      BVar5 = DeleteProperty(&pSVar6->
                              super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>
                             ,_propertyOperationFlags_local,scriptContext._4_4_,
                             (PropertyOperationFlags)scriptContext);
      return BVar5;
    }
    ppRVar11 = Memory::WriteBarrierPtr::operator_cast_to_RecyclerWeakReference__
                         ((WriteBarrierPtr *)&this->singletonInstance);
    pDVar2 = _propertyOperationFlags_local;
    if (*ppRVar11 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
      this_02 = Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicObject>_>::
                operator->(&this->singletonInstance);
      pDVar12 = Memory::RecyclerWeakReference<Js::DynamicObject>::Get(this_02);
      if (pDVar2 != pDVar12) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x6f4,
                                    "(this->singletonInstance == nullptr || instance == this->singletonInstance->Get())"
                                    ,
                                    "this->singletonInstance == nullptr || instance == this->singletonInstance->Get()"
                                   );
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
    }
    descriptor_00 = propertyRecord;
    propertyKey = undefined;
    pSVar9 = RecyclableObject::GetScriptContext
                       (&_propertyOperationFlags_local->super_RecyclableObject);
    SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false>::
    InvalidateFixedField<Js::PropertyRecord_const*>
              ((SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false> *)this,
               (PropertyRecord *)propertyKey,
               (SimpleDictionaryPropertyDescriptor<int> *)descriptor_00,pSVar9);
    bVar4 = DynamicTypeHandler::GetFlags(&this->super_DynamicTypeHandler);
    if ((bVar4 & 0x20) != 0) {
      ScriptContext::InvalidateProtoCaches((ScriptContext *)descriptor,scriptContext._4_4_);
    }
    if (((byte)this->field_0x28 >> 1 & 1) != 0) {
      pSVar6 = AsUnordered(this);
      bVar3 = SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_false>::
              TryRegisterDeletedPropertyIndex
                        (pSVar6,_propertyOperationFlags_local,
                         *(int *)((long)&(propertyRecord->super_FinalizableObject).
                                         super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject +
                                 4));
      if (bVar3) goto LAB_0149df1c;
    }
    DynamicTypeHandler::SetSlotUnchecked
              (_propertyOperationFlags_local,
               *(int *)((long)&(propertyRecord->super_FinalizableObject).
                               super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + 4),
               pRVar10);
  }
LAB_0149df1c:
  *(undefined1 *)
   ((long)&(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
           _vptr_IRecyclerVisitedObject + 1) = 0xe;
  this_03 = RecyclableObject::GetType(&_propertyOperationFlags_local->super_RecyclableObject);
  BVar5 = Js::Type::HasBeenCached(this_03);
  if (BVar5 != 0) {
    DynamicObject::ChangeType(_propertyOperationFlags_local);
  }
  DynamicTypeHandler::SetPropertyUpdateSideEffect
            (&this->super_DynamicTypeHandler,_propertyOperationFlags_local,scriptContext._4_4_,
             (Var)0x0,SideEffects_Any);
  return 1;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::DeleteProperty_Internal(DynamicObject* instance, PropertyId propertyId, PropertyOperationFlags propertyOperationFlags)
    {
        if(!GetIsLocked())
        {
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
            if (CONFIG_FLAG(ForceStringKeyedSimpleDictionaryTypeHandler) &&
                !TMapKey_IsJavascriptString<TMapKey>() &&
                !isUnordered && !hasNamelessPropertyId)
            {
                return ConvertToSimpleDictionaryUnorderedTypeHandler<TPropertyIndex, JavascriptString*, IsNotExtensibleSupported>(instance)
                    ->DeleteProperty(instance, propertyId, propertyOperationFlags);
            }
#endif

            if (instance->GetDynamicType()->GetIsLocked())
            {
                Assert(!GetIsShared() && !instance->GetDynamicType()->GetIsShared());

                // We have changed the type of the only instance using this type handler, so we don't need to say the type handler is shared here.
                instance->ChangeType();
            }

            ScriptContext* scriptContext = instance->GetScriptContext();
            SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;
            Assert(propertyId != Constants::NoProperty);
            PropertyRecord const* propertyRecord = instance->GetScriptContext()->GetPropertyName(propertyId);
            if (propertyMap->TryGetReference(propertyRecord, &descriptor))
            {
                if (descriptor->Attributes & (PropertyDeleted | (!allowLetConstGlobal ? PropertyLetConstGlobal : 0)))
                {
                    // If PropertyLetConstGlobal is present then we have a let/const and no global property,
                    // since SimpleDictionaryTypeHandler does not support shadowing which means it can only
                    // have one or the other.  Therefore return true for no property found if allowLetConstGlobal
                    // is false.  If allowLetConstGlobal is true we will enter the else if branch below and
                    // return false since let/const variables cannot be deleted.
                    return true;
                }
                else if (!(descriptor->Attributes & PropertyConfigurable) ||
                    (allowLetConstGlobal && (descriptor->Attributes & PropertyLetConstGlobal)))
                {
                    JavascriptError::ThrowCantDeleteIfStrictModeOrNonconfigurable(
                        propertyOperationFlags, scriptContext, propertyRecord->GetBuffer());

                    return false;
                }
                Assert(!(descriptor->Attributes & PropertyLetConstGlobal));
                Var undefined = scriptContext->GetLibrary()->GetUndefined();
                if (descriptor->propertyIndex != NoSlots)
                {
                    if (SupportsSwitchingToUnordered(scriptContext))
                    {
                        ++numDeletedProperties;
                        if (numDeletedProperties >= CONFIG_FLAG(DeletedPropertyReuseThreshold))
                        {
                            // This type handler is being used as a hashtable. Start reusing deleted property indexes for new
                            // property IDs. After this, enumeration order is nondeterministic.
                            // Also use JavascriptString* as the property map key so that PropertyRecords can be avoided
                            // entirely where possible.

                            // Check if prototype chain has enumerable properties, according to logic used in
                            // ForInObjectEnumerator::Initialize().  If there are enumerable properties in the
                            // prototype chain, then enumerating this object's properties will require keeping
                            // track of properties so that shadowed properties are not included, but doing so
                            // currently requires converting the property to a PropertyRecord with a PropertyId
                            // for use in a bit vector that tracks shadowing.  To avoid having a string keyed
                            // type handler hit this, only convert to the string keyed type handler if the
                            // prototype chain does not have enumerable properties.
                            bool fConvertToStringKeyedHandler =
                                !hasNamelessPropertyId &&
                                ForInObjectEnumerator::GetFirstPrototypeWithEnumerableProperties(instance) == nullptr;

                            if (fConvertToStringKeyedHandler)
                            {
                                PHASE_PRINT_TESTTRACE1(Js::TypeHandlerTransitionPhase, _u("Transitioning to string keyed SimpleDictionaryUnorderedTypeHandler\n"));
                                // if TMapKey is already JavascriptString* we will not get here because we'd
                                // already be unordered and SupportsSwitchingToUnordered would have returned false
                                return ConvertToSimpleDictionaryUnorderedTypeHandler<TPropertyIndex, JavascriptString*, IsNotExtensibleSupported>(instance)
                                    ->DeleteProperty(instance, propertyId, propertyOperationFlags);
                            }
                            else
                            {
                                PHASE_PRINT_TESTTRACE1(Js::TypeHandlerTransitionPhase, _u("Transitioning to PropertyRecord keyed SimpleDictionaryUnorderedTypeHandler\n"));
                                return ConvertToSimpleDictionaryUnorderedTypeHandler<TPropertyIndex, TMapKey, IsNotExtensibleSupported>(instance)
                                    ->DeleteProperty(instance, propertyId, propertyOperationFlags);
                            }
                        }
                    }

#if ENABLE_FIXED_FIELDS
                    Assert(this->singletonInstance == nullptr || instance == this->singletonInstance->Get());
                    InvalidateFixedField(propertyRecord, descriptor, instance->GetScriptContext());
#endif

                    if (this->GetFlags() & IsPrototypeFlag)
                    {
                        scriptContext->InvalidateProtoCaches(propertyId);
                    }

                    // If this is an unordered type handler, register the deleted property index so that it can be reused for
                    // other property IDs added later
                    if(!isUnordered ||
                        !AsUnordered()->TryRegisterDeletedPropertyIndex(instance, descriptor->propertyIndex))
                    {
                        SetSlotUnchecked(instance, descriptor->propertyIndex, undefined);
                    }
                }
                descriptor->Attributes = PropertyDeletedDefaults;

                // Change the type so as we can invalidate the cache in fast path jit
                if (instance->GetType()->HasBeenCached())
                {
                    instance->ChangeType();
                }
                SetPropertyUpdateSideEffect(instance, propertyId, nullptr, SideEffects_Any);
                return true;
            }

            // Check for a numeric propertyRecord only if objectArray available
            if (instance->HasObjectArray() && propertyRecord->IsNumeric())
            {
                return SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::DeleteItem(instance, propertyRecord->GetNumericValue(), propertyOperationFlags);
            }
        }
        else
        {
            SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported> *simpleBase = ConvertToNonSharedSimpleDictionaryType(instance);
            return simpleBase->DeleteProperty_Internal<allowLetConstGlobal>(instance, propertyId, propertyOperationFlags);
        }
        return true;
    }